

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::JITPageAddrToFuncRangeCache::AddFuncRange
          (JITPageAddrToFuncRangeCache *this,void *address,uint bytes)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *pHVar3;
  BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar4;
  BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  uint uVar5;
  undefined1 local_70 [8];
  uint byteCount;
  size_t local_60;
  char *local_58;
  DWORD local_50;
  void *local_48;
  void *pageAddr;
  RangeMap *rangeMap;
  void *pvStack_30;
  uint bytes_local;
  void *address_local;
  
  uVar5 = (uint)address;
  rangeMap._4_4_ = bytes;
  pvStack_30 = address;
  CCLock::Enter((CCLock *)&cs);
  if (bytes < 0x1001) {
    this_00 = this->jitPageAddrToFuncRangeMap;
    if (this_00 ==
        (BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1ac9;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      this_00 = (BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2ff150);
      this_00->buckets = (Type)0x0;
      this_00->entries = (Type)0x0;
      this_00->alloc = &Memory::HeapAllocator::Instance;
      this_00->size = 0;
      this_00->bucketCount = 0;
      this_00->count = 0;
      this_00->freeCount = 0;
      this_00->modFunctionIndex = 0x4b;
      this_00->stats = (Type)0x0;
      JsUtil::
      BaseDictionary<void_*,_JsUtil::BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Initialize(this_00,0x403);
      this->jitPageAddrToFuncRangeMap = this_00;
      uVar5 = (uint)pvStack_30;
    }
    local_48 = (void *)(ulong)(uVar5 & 0xfffff000);
    pageAddr = (void *)0x0;
    bVar2 = JsUtil::
            BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_00,&local_48,
                       (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        **)&pageAddr);
    if (pageAddr == (void *)0x0) {
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x1ad1,"(!isPageAddrFound)","!isPageAddrFound");
        if (!bVar2) goto LAB_007902dc;
        *puVar4 = 0;
      }
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1ad2;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      pageAddr = new<Memory::HeapAllocator>(0x38,pHVar3,0x2ff150);
      *(undefined8 *)pageAddr = 0;
      *(undefined8 *)((long)pageAddr + 8) = 0;
      *(HeapAllocator **)((long)pageAddr + 0x10) = &Memory::HeapAllocator::Instance;
      *(undefined8 *)((long)pageAddr + 0x18) = 0;
      *(undefined4 *)((long)pageAddr + 0x20) = 0;
      *(undefined8 *)((long)pageAddr + 0x28) = 0x4b00000000;
      *(undefined8 *)((long)pageAddr + 0x30) = 0;
      JsUtil::
      BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->jitPageAddrToFuncRangeMap,&local_48,
                 (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  **)&pageAddr);
    }
    local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
    bVar2 = JsUtil::
            BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)pageAddr,&stack0xffffffffffffffd0,(uint *)local_70);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1ad6,"(!rangeMap->TryGetValue(address, &byteCount))",
                                  "!rangeMap->TryGetValue(address, &byteCount)");
      if (!bVar2) {
LAB_007902dc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    JsUtil::
    BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)pageAddr,&stack0xffffffffffffffd0,(uint *)((long)&rangeMap + 4));
  }
  else {
    this_01 = this->largeJitFuncToSizeMap;
    if (this_01 ==
        (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_70 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      _byteCount = 0;
      local_60 = 0xffffffffffffffff;
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_50 = 0x1add;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      this_01 = (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2ff150);
      this_01->buckets = (Type)0x0;
      this_01->entries = (Type)0x0;
      this_01->alloc = &Memory::HeapAllocator::Instance;
      this_01->size = 0;
      this_01->bucketCount = 0;
      this_01->count = 0;
      this_01->freeCount = 0;
      this_01->modFunctionIndex = 0x4b;
      this_01->stats = (Type)0x0;
      JsUtil::
      BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Initialize(this_01,0x403);
      this->largeJitFuncToSizeMap = this_01;
    }
    local_70 = (undefined1  [8])((ulong)local_70 & 0xffffffff00000000);
    bVar2 = JsUtil::
            BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this_01,&stack0xffffffffffffffd0,(uint *)local_70);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1ae1,
                                  "(!largeJitFuncToSizeMap->TryGetValue(address, &byteCount))",
                                  "!largeJitFuncToSizeMap->TryGetValue(address, &byteCount)");
      if (!bVar2) goto LAB_007902dc;
      *puVar4 = 0;
    }
    JsUtil::
    BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->largeJitFuncToSizeMap,&stack0xffffffffffffffd0,(uint *)((long)&rangeMap + 4)
              );
  }
  CCLock::Leave((CCLock *)&cs);
  return;
}

Assistant:

void JITPageAddrToFuncRangeCache::AddFuncRange(void * address, uint bytes)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        if (bytes <= AutoSystemInfo::PageSize)
        {
            if (jitPageAddrToFuncRangeMap == nullptr)
            {
                jitPageAddrToFuncRangeMap = HeapNew(JITPageAddrToFuncRangeMap, &HeapAllocator::Instance, 1027);
            }

            void * pageAddr = GetPageAddr(address);
            RangeMap * rangeMap = nullptr;
            bool isPageAddrFound = jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap);
            if (rangeMap == nullptr)
            {
                Assert(!isPageAddrFound);
                rangeMap = HeapNew(RangeMap, &HeapAllocator::Instance);
                jitPageAddrToFuncRangeMap->Add(pageAddr, rangeMap);
            }
            uint byteCount = 0;
            Assert(!rangeMap->TryGetValue(address, &byteCount));
            rangeMap->Add(address, bytes);
        }
        else
        {
            if (largeJitFuncToSizeMap == nullptr)
            {
                largeJitFuncToSizeMap = HeapNew(LargeJITFuncAddrToSizeMap, &HeapAllocator::Instance, 1027);
            }

            uint byteCount = 0;
            Assert(!largeJitFuncToSizeMap->TryGetValue(address, &byteCount));
            largeJitFuncToSizeMap->Add(address, bytes);
        }
    }